

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O1

void __thiscall
ktx::CommandCompare::compareKVD(CommandCompare *this,PrintDiff *diff,InputStreams *streams)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pcVar1;
  void *pvVar2;
  undefined1 *puVar3;
  int iVar4;
  long lVar5;
  _Alloc_hider _Var6;
  iterator iVar7;
  CommandCompare *pCVar8;
  long lVar9;
  ulong uVar10;
  _Self __tmp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  ulong uVar11;
  undefined8 this_02;
  CommandCompare *pCVar12;
  uint uVar13;
  bool bVar14;
  iterator it [2];
  ktxHashList kvDataHead;
  ktx_uint32_t keyLen;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
  keys [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> keyValueStores [2];
  char *key;
  CommandCompare *local_138 [2];
  PrintDiff *local_128;
  key_type local_120;
  undefined8 local_100;
  _Alloc_hider local_f8;
  InputStreams *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  undefined1 auStack_c0 [8];
  undefined1 local_b8 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  long local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68 [2];
  char *local_38;
  
  if ((this->options).super_OptionsCompare.ignoreAllMetadata == false) {
    local_128 = diff;
    local_f0 = streams;
    local_c8 = (undefined1  [8])local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Key/Value Data\n\n","");
    this_00 = &local_128->context;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(this_00,(local_128->context).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
    this_02 = local_c8;
    if (local_c8 != (undefined1  [8])local_b8) {
      operator_delete((void *)local_c8,local_b8._0_8_ + 1);
    }
    lVar5 = 0;
    do {
      *(undefined8 *)
       ((long)&local_68[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start + lVar5) = 0;
      *(undefined8 *)
       ((long)&local_68[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish + lVar5) = 0;
      *(undefined8 *)
       ((long)&local_68[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage + lVar5) = 0;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x30);
    lVar5 = 0;
    do {
      *(undefined8 *)(local_b8 + lVar5) = 0;
      *(undefined8 *)(local_b8 + lVar5 + 8) = 0;
      *(undefined8 *)(local_b8 + lVar5 + 0x10) = 0;
      *(undefined8 *)(local_b8 + lVar5 + 0x18) = 0;
      *(undefined8 *)(auStack_c0 + lVar5 + -8) = 0;
      *(undefined8 *)(auStack_c0 + lVar5) = 0;
      *(undefined1 **)(local_b8 + lVar5 + 8) = auStack_c0 + lVar5;
      *(undefined1 **)(local_b8 + lVar5 + 0x10) = auStack_c0 + lVar5;
      *(undefined8 *)(local_b8 + lVar5 + 0x18) = 0;
      lVar5 = lVar5 + 0x30;
    } while (lVar5 != 0x60);
    local_100 = &(this->super_Command).super_Reporter;
    local_f8._M_p = (pointer)this;
    lVar5 = 0;
    do {
      uVar11 = (ulong)(this->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar5].keyValueData.byteLength;
      _Var6._M_p = (pointer)local_138[0];
      if (uVar11 != 0) {
        local_e8._M_allocated_capacity = lVar5 * 3;
        this_01 = local_68 + lVar5;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_01,uVar11);
        puVar3 = &local_f0->field_0x0;
        local_d8._0_8_ = 7;
        local_d8._8_8_ = "the KVD";
        read(this,(int)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (puVar3 + lVar5 * 0x3b8),
             (void *)(ulong)(this->headers).
                            super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar5].keyValueData.byteOffset,
             (size_t)(this_01->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start);
        local_120._M_dataplus._M_p = (pointer)0x0;
        this_02 = &local_120;
        iVar4 = ktxHashList_Deserialize
                          (this_02,(this->headers).
                                   super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar5].keyValueData.
                                   byteLength,
                           (this_01->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start);
        if (iVar4 != 0) {
          this_02 = local_100;
          Reporter::fatal<char_const(&)[34],std::__cxx11::string_const&>
                    ((Reporter *)local_100,DFD_FAILURE,
                     (char (*) [34])"Failed to parse KVD in file \"{}\".",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (puVar3 + lVar5 * 0x3b8));
        }
        this = (CommandCompare *)local_f8._M_p;
        _Var6._M_p = (pointer)local_138[0];
        if ((CommandCompare *)local_120._M_dataplus._M_p != (CommandCompare *)0x0) {
          lVar9 = local_e8._M_allocated_capacity * 0x10;
          _Var6._M_p = local_120._M_dataplus._M_p;
          uVar13 = 0;
          do {
            local_138[0] = (CommandCompare *)_Var6._M_p;
            ktxHashListEntry_GetKey(_Var6._M_p,local_e8._M_local_buf + 0xc,&local_38);
            std::
            _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,ktxKVListEntry*>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,ktxKVListEntry*>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,ktxKVListEntry*>>>
            ::_M_emplace_unique<char*&,ktxKVListEntry*&>
                      ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,ktxKVListEntry*>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,ktxKVListEntry*>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,ktxKVListEntry*>>>
                        *)(auStack_c0 + lVar9 + -8),&local_38,(ktxKVListEntry **)local_138);
            _Var6._M_p = (pointer)ktxHashList_Next();
            this_02 = local_138[0];
            this = (CommandCompare *)local_f8._M_p;
            if ((CommandCompare *)_Var6._M_p == (CommandCompare *)0x0) break;
            bVar14 = uVar13 < 99;
            uVar13 = uVar13 + 1;
          } while (bVar14);
        }
      }
      local_138[0] = (CommandCompare *)_Var6._M_p;
      bVar14 = lVar5 == 0;
      lVar5 = lVar5 + 1;
    } while (bVar14);
    local_138[0] = (CommandCompare *)local_b8._8_8_;
    local_138[1] = (CommandCompare *)local_80._M_allocated_capacity;
    if ((CommandCompare *)local_80._M_allocated_capacity != (CommandCompare *)(local_b8 + 0x28) ||
        (CommandCompare *)local_b8._8_8_ != (CommandCompare *)auStack_c0) {
      lVar5 = 0;
LAB_0012e0d4:
      do {
        pCVar12 = local_138[lVar5];
        if (pCVar12 == (CommandCompare *)(auStack_c0 + lVar5 * 0x30)) {
          bVar14 = false;
        }
        else {
          pcVar1 = (pCVar12->super_Command).super_Reporter.commandDescription._M_dataplus._M_p;
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_120,pcVar1,
                     pcVar1 + *(long *)((long)&(pCVar12->super_Command).super_Reporter.commandName.
                                               field_2 + 8));
          iVar7 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(&(this->options).super_OptionsCompare.ignoreMetadataKeys._M_h,&local_120);
          bVar14 = iVar7.
                   super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ._M_cur != (__node_type *)0x0;
          this_02 = local_120._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
        }
        pCVar8 = local_138[0];
        if (bVar14) {
          pCVar8 = (CommandCompare *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar12);
          local_138[lVar5] = pCVar8;
          pCVar8 = pCVar12;
        }
        else {
          bVar14 = lVar5 == 0;
          lVar5 = lVar5 + 1;
          if (bVar14) goto LAB_0012e0d4;
          if (local_138[0] == (CommandCompare *)auStack_c0) {
LAB_0012e1e7:
            pCVar12 = local_138[1];
            if (local_138[1] == (CommandCompare *)(local_b8 + 0x28)) {
LAB_0012e291:
              compareKVEntry((CommandCompare *)this_02,local_128,
                             (string_view *)
                             ((long)&(pCVar8->super_Command).super_Reporter.commandName.field_2 + 8)
                             ,(ktxHashListEntry *)
                              (pCVar8->super_Command).super_Reporter.commandDescription.
                              _M_string_length,
                             (ktxHashListEntry *)
                             (pCVar12->super_Command).super_Reporter.commandDescription.
                             _M_string_length);
              local_138[0] = (CommandCompare *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar8)
              ;
            }
            else {
              if (pCVar8 != (CommandCompare *)auStack_c0) {
                uVar11 = *(ulong *)((long)&(pCVar8->super_Command).super_Reporter.commandName.
                                           field_2 + 8);
                uVar10 = *(ulong *)((long)&(local_138[1]->super_Command).super_Reporter.commandName.
                                           field_2 + 8);
                lVar5 = uVar11 - uVar10;
                if (uVar11 < uVar10) {
                  uVar10 = uVar11;
                }
                if (uVar10 == 0) {
                  iVar4 = 0;
                }
                else {
                  this_02 = (pCVar8->super_Command).super_Reporter.commandDescription._M_dataplus.
                            _M_p;
                  iVar4 = memcmp((void *)this_02,
                                 (local_138[1]->super_Command).super_Reporter.commandDescription.
                                 _M_dataplus._M_p,uVar10);
                }
                if (iVar4 == 0) {
                  if (lVar5 < -0x7fffffff) {
                    lVar5 = -0x80000000;
                  }
                  if (0x7ffffffe < lVar5) {
                    lVar5 = 0x7fffffff;
                  }
                  iVar4 = (int)lVar5;
                }
                if (iVar4 < 1) goto LAB_0012e291;
              }
              compareKVEntry((CommandCompare *)this_02,local_128,
                             (string_view *)
                             ((long)&(pCVar12->super_Command).super_Reporter.commandName.field_2 + 8
                             ),(ktxHashListEntry *)0x0,
                             (ktxHashListEntry *)
                             (pCVar12->super_Command).super_Reporter.commandDescription.
                             _M_string_length);
            }
            local_138[1] = (CommandCompare *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar12);
            pCVar8 = pCVar12;
          }
          else {
            if (local_138[1] != (CommandCompare *)(local_b8 + 0x28)) {
              uVar11 = *(ulong *)((long)&(local_138[0]->super_Command).super_Reporter.commandName.
                                         field_2 + 8);
              uVar10 = *(ulong *)((long)&(local_138[1]->super_Command).super_Reporter.commandName.
                                         field_2 + 8);
              lVar5 = uVar11 - uVar10;
              if (uVar11 < uVar10) {
                uVar10 = uVar11;
              }
              if (uVar10 == 0) {
                iVar4 = 0;
              }
              else {
                this_02 = (local_138[0]->super_Command).super_Reporter.commandDescription.
                          _M_dataplus._M_p;
                iVar4 = memcmp((void *)this_02,
                               (local_138[1]->super_Command).super_Reporter.commandDescription.
                               _M_dataplus._M_p,uVar10);
              }
              if (iVar4 == 0) {
                if (lVar5 < -0x7fffffff) {
                  lVar5 = -0x80000000;
                }
                if (0x7ffffffe < lVar5) {
                  lVar5 = 0x7fffffff;
                }
                iVar4 = (int)lVar5;
              }
              if (-1 < iVar4) goto LAB_0012e1e7;
            }
            compareKVEntry((CommandCompare *)this_02,local_128,
                           (string_view *)
                           ((long)&(pCVar8->super_Command).super_Reporter.commandName.field_2 + 8),
                           (ktxHashListEntry *)
                           (pCVar8->super_Command).super_Reporter.commandDescription.
                           _M_string_length,(ktxHashListEntry *)0x0);
            local_138[0] = (CommandCompare *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar8);
          }
        }
        this_02 = pCVar8;
        lVar5 = 0;
      } while ((local_138[0] != (CommandCompare *)auStack_c0) ||
              (lVar5 = 0, local_138[1] != (CommandCompare *)(local_b8 + 0x28)));
    }
    lVar5 = 0x30;
    do {
      std::
      _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
                   *)(auStack_c0 + lVar5 + -8));
      lVar5 = lVar5 + -0x30;
    } while (lVar5 != -0x30);
    lVar5 = 0x30;
    do {
      pvVar2 = *(void **)((long)&local_80 + lVar5);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,*(long *)((long)&local_70 + lVar5) - (long)pvVar2);
      }
      lVar5 = lVar5 + -0x18;
    } while (lVar5 != 0);
  }
  return;
}

Assistant:

void CommandCompare::compareKVD(PrintDiff& diff, InputStreams& streams) {
    if (options.ignoreAllMetadata) return;

    diff.setContext("Key/Value Data\n\n");

    std::vector<uint8_t> keyValueStores[2] = {};
    std::map<std::string_view, ktxHashListEntry*> keys[2] = {};

    for (std::size_t i = 0; i < streams.size(); ++i) {
        if (headers[i].keyValueData.byteLength == 0) continue;

        keyValueStores[i].resize(headers[i].keyValueData.byteLength);
        read(streams[i], headers[i].keyValueData.byteOffset, keyValueStores[i].data(),
            headers[i].keyValueData.byteLength, "the KVD");

        ktxHashList kvDataHead = nullptr;
        KTX_error_code result = ktxHashList_Deserialize(&kvDataHead,
            headers[i].keyValueData.byteLength, keyValueStores[i].data());
        if (result != KTX_SUCCESS)
            fatal(rc::KTX_FAILURE, "Failed to parse KVD in file \"{}\".", streams[i].str());

        if (kvDataHead == nullptr)
            continue;

        uint32_t entryIndex = 0;
        ktxHashListEntry* entry = kvDataHead;
        for (; entry != NULL && entryIndex < MAX_NUM_KV_ENTRIES; entry = ktxHashList_Next(entry), ++entryIndex) {
            char* key;
            ktx_uint32_t keyLen;
            ktxHashListEntry_GetKey(entry, &keyLen, &key);
            keys[i].emplace(key, entry);
        }
    }

    std::map<std::string_view, ktxHashListEntry*>::iterator it[2] = { keys[0].begin(), keys[1].begin() };
    while (it[0] != keys[0].end() || it[1] != keys[1].end()) {
        bool ignoreKey = false;
        for (std::size_t i = 0; i < streams.size(); ++i)
            if ((it[i] != keys[i].end()) &&
                (options.ignoreMetadataKeys.find(std::string(it[i]->first)) != options.ignoreMetadataKeys.end())) {
                // Key is on the ignore list, skip it
                it[i]++;
                ignoreKey = true;
                break;
            }
        if (ignoreKey) continue;

        if ((it[0] != keys[0].end()) && ((it[1] == keys[1].end()) || (it[0]->first < it[1]->first))) {
            // First stream has a key that is not present in the second stream
            compareKVEntry(diff, it[0]->first, it[0]->second, nullptr);
            it[0]++;
        } else if ((it[1] != keys[1].end()) && ((it[0] == keys[0].end()) || (it[0]->first > it[1]->first))) {
            // Second stream has a key that is not present in the first stream
            compareKVEntry(diff, it[1]->first, nullptr, it[1]->second);
            it[1]++;
        } else {
            // Both streams have the key
            compareKVEntry(diff, it[0]->first, it[0]->second, it[1]->second);
            it[0]++;
            it[1]++;
        }
    }
}